

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_domain.c
# Opt level: O1

int nhdp_domain_metric_add(nhdp_domain_metric *metric)

{
  int iVar1;
  
  (metric->_node).key = metric->name;
  if (metric->incoming_link_start == 0) {
    metric->incoming_link_start = 0xffff00;
  }
  if (metric->outgoing_link_start == 0) {
    metric->outgoing_link_start = 0xffffff;
  }
  if (metric->incoming_2hop_start == 0) {
    metric->incoming_2hop_start = 0xffffff;
  }
  if (metric->outgoing_2hop_start == 0) {
    metric->outgoing_2hop_start = 0xffffff;
  }
  if (metric->link_to_string == (_func_char_ptr_nhdp_metric_str_ptr_uint32_t *)0x0) {
    metric->link_to_string = _link_to_string;
  }
  if (metric->path_to_string == (_func_char_ptr_nhdp_metric_str_ptr_uint32_t_uint8_t *)0x0) {
    metric->path_to_string = _path_to_string;
  }
  if (metric->internal_link_to_string == (_func_char_ptr_nhdp_metric_str_ptr_nhdp_link_ptr *)0x0) {
    metric->internal_link_to_string = _int_to_string;
  }
  iVar1 = avl_insert(&_domain_metrics,&metric->_node);
  return iVar1;
}

Assistant:

int
nhdp_domain_metric_add(struct nhdp_domain_metric *metric) {
  /* initialize key */
  metric->_node.key = metric->name;

  /* insert default values if not set */
  if (metric->incoming_link_start == 0) {
    metric->incoming_link_start = RFC7181_METRIC_MAX;
  }
  if (metric->outgoing_link_start == 0) {
    metric->outgoing_link_start = RFC7181_METRIC_INFINITE;
  }
  if (metric->incoming_2hop_start == 0) {
    metric->incoming_2hop_start = RFC7181_METRIC_INFINITE;
  }
  if (metric->outgoing_2hop_start == 0) {
    metric->outgoing_2hop_start = RFC7181_METRIC_INFINITE;
  }

  /* initialize to_string method if empty */
  if (metric->link_to_string == NULL) {
    metric->link_to_string = _link_to_string;
  }
  if (metric->path_to_string == NULL) {
    metric->path_to_string = _path_to_string;
  }

  if (metric->internal_link_to_string == NULL) {
    metric->internal_link_to_string = _int_to_string;
  }

  /* hook into tree */
  return avl_insert(&_domain_metrics, &metric->_node);
}